

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

void __thiscall db_packer::process_folder(db_packer *this,string *path)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  path *this_00;
  string_type local_f0;
  directory_entry *local_d0;
  directory_entry *de;
  undefined1 local_b8 [8];
  recursive_directory_iterator __end1;
  undefined1 local_98 [8];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  path fullpath;
  string *path_local;
  db_packer *this_local;
  
  fullpath._32_8_ = path;
  std::operator+(&local_60,&this->m_root,path);
  std::filesystem::__cxx11::path::path((path *)local_40,&local_60,auto_format);
  std::__cxx11::string::~string((string *)&local_60);
  bVar2 = std::filesystem::exists((path *)local_40);
  if ((bVar2) && (bVar2 = std::filesystem::is_directory((path *)local_40), bVar2)) {
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount,(path *)local_40);
    p_Var1 = &__begin1._M_dirs._M_refcount;
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,
               (recursive_directory_iterator *)p_Var1);
    std::filesystem::__cxx11::begin
              ((__cxx11 *)local_98,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&de,(recursive_directory_iterator *)p_Var1);
    std::filesystem::__cxx11::end((recursive_directory_iterator *)local_b8);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&de);
    while (bVar2 = std::filesystem::__cxx11::operator!=
                             ((recursive_directory_iterator *)local_98,
                              (recursive_directory_iterator *)local_b8), bVar2) {
      local_d0 = (directory_entry *)
                 std::filesystem::__cxx11::recursive_directory_iterator::operator*
                           ((recursive_directory_iterator *)local_98);
      bVar2 = std::filesystem::__cxx11::directory_entry::is_regular_file(local_d0);
      if (bVar2) {
        this_00 = std::filesystem::__cxx11::directory_entry::path(local_d0);
        std::filesystem::__cxx11::path::operator_cast_to_string(&local_f0,this_00);
        process_file(this,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      std::filesystem::__cxx11::recursive_directory_iterator::operator++
                ((recursive_directory_iterator *)local_98);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_b8);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_98);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount);
  }
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return;
}

Assistant:

void db_packer::process_folder(const std::string& path)
{
#ifdef WIN32
	if (!path.empty()) {
		for (std::vector<std::string>::iterator it = m_folders.begin(),
				end = m_folders.end(); it != end; ++it) {
			if (path.compare(0, it->size(), *it) == 0) {
				*it = path;
				goto found;
			}
		}
		m_folders.push_back(path);
	}
found:
	WIN32_FIND_DATAA info;
	HANDLE h = FindFirstFileA((m_root + path + '*').c_str(), &info);
	if (h == INVALID_HANDLE_VALUE)
		return;
	do {
		xr_strlwr(info.cFileName, sizeof(info.cFileName));
		if (info.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) {
			if (std::strcmp(info.cFileName, ".") != 0 && std::strcmp(info.cFileName, "..") != 0)
				process_folder((path + info.cFileName) + '\\');
		} else {
			process_file(path + info.cFileName);
		}
	} while (FindNextFileA(h, &info));
	FindClose(h);
#else
	fs::path fullpath(m_root + path);

	if(!fs::exists(fullpath) || !fs::is_directory(fullpath))
		return;

	for(auto const& de: fs::recursive_directory_iterator(fullpath))
	{
		if(de.is_regular_file())
			process_file(de.path());
	}
#endif
}